

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalNinjaGenerator::AppendCustomCommandLines
          (cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  uint uVar3;
  uint uVar4;
  OutputFormat OVar5;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  string_view source;
  string_view source_00;
  string cdStr;
  string wd;
  string launcher;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1b8;
  cmGlobalGenerator *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1b0 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  local_1b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cmdLines;
  uVar3 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
  if (uVar3 != 0) {
    cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_1d8,ccg);
    if (local_1d8._M_string_length == 0) {
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      std::__cxx11::string::_M_assign((string *)&local_1d8);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"cd ","");
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    source._M_str = local_1d8._M_dataplus._M_p;
    source._M_len = local_1d8._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_218,(cmOutputConverter *)this,source,SHELL,false);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_218._M_dataplus._M_p,local_218._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_1b8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  MakeCustomLauncher_abi_cxx11_((string *)local_1a8,this,ccg);
  uVar3 = 0;
  while( true ) {
    uVar4 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar3 == uVar4) break;
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&local_1d8,ccg,uVar3);
    sVar2 = local_1d8._M_string_length;
    _Var1._M_p = local_1d8._M_dataplus._M_p;
    if (local_1d8._M_string_length != 0) {
      OVar5 = (*local_1b0->_vptr_cmGlobalGenerator[0x28])();
      source_00._M_str = _Var1._M_p;
      source_00._M_len = sVar2;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_218,(cmOutputConverter *)this,source_00,OVar5 & 0xff,false);
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_218,0,(char *)0x0,local_1a8._0_8_);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_1f8.field_2._M_allocated_capacity = *psVar8;
        local_1f8.field_2._8_8_ = plVar7[3];
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar8;
        local_1f8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1b8,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      cmCustomCommandGenerator::AppendArguments(ccg,uVar3,*(pointer *)(local_1b8 + 8) + -1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    uVar3 = uVar3 + 1;
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::AppendCustomCommandLines(
  cmCustomCommandGenerator const& ccg, std::vector<std::string>& cmdLines)
{
  auto* gg = this->GetGlobalNinjaGenerator();

  if (ccg.GetNumberOfCommands() > 0) {
    std::string wd = ccg.GetWorkingDirectory();
    if (wd.empty()) {
      wd = this->GetCurrentBinaryDirectory();
    }

    std::ostringstream cdCmd;
#ifdef _WIN32
    std::string cdStr = "cd /D ";
#else
    std::string cdStr = "cd ";
#endif
    cdCmd << cdStr
          << this->ConvertToOutputFormat(wd, cmOutputConverter::SHELL);
    cmdLines.push_back(cdCmd.str());
  }

  std::string launcher = this->MakeCustomLauncher(ccg);

  for (unsigned i = 0; i != ccg.GetNumberOfCommands(); ++i) {
    std::string c = ccg.GetCommand(i);
    if (c.empty()) {
      continue;
    }
    cmdLines.push_back(launcher +
                       this->ConvertToOutputFormat(
                         c,
                         gg->IsMultiConfig() ? cmOutputConverter::NINJAMULTI
                                             : cmOutputConverter::SHELL));

    std::string& cmd = cmdLines.back();
    ccg.AppendArguments(i, cmd);
  }
}